

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

_Bool sysbvm_tuple_equals(sysbvm_context_t *context,sysbvm_tuple_t a,sysbvm_tuple_t b)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t equalsFunction;
  sysbvm_tuple_t type;
  sysbvm_tuple_t b_local;
  sysbvm_tuple_t a_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_tuple_getType(context,a);
  if ((sVar1 == 0) || (sVar1 = sysbvm_type_getEqualsFunction(context,sVar1), sVar1 == 0)) {
    context_local._7_1_ = sysbvm_tuple_identityEquals(a,b);
  }
  else {
    sVar1 = sysbvm_function_apply2(context,sVar1,a,b);
    context_local._7_1_ = sysbvm_tuple_boolean_decode(sVar1);
  }
  return context_local._7_1_;
}

Assistant:

SYSBVM_API bool sysbvm_tuple_equals(sysbvm_context_t *context, sysbvm_tuple_t a, sysbvm_tuple_t b)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, a);
    if(type)
    {
        sysbvm_tuple_t equalsFunction = sysbvm_type_getEqualsFunction(context, type);
        if(equalsFunction)
            return sysbvm_tuple_boolean_decode(sysbvm_function_apply2(context, equalsFunction, a, b));
    }

    return sysbvm_tuple_identityEquals(a, b);
}